

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::currencySymbol(QLocale *this,CurrencySymbolFormat format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  size_t sVar3;
  int in_EDX;
  DataRange *in_RDI;
  long in_FS_OFFSET;
  size_t len;
  char *code;
  QString *res;
  QVariant *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QSystemLocale *in_stack_ffffffffffffff48;
  char16_t *in_stack_ffffffffffffff50;
  DataRange *str;
  char16_t local_48 [16];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d9a76);
  if (pQVar2->m_data == &systemLocaleData) {
    in_RDI[2] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    *in_RDI = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI[1] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffff48 = systemLocale();
    in_stack_ffffffffffffff50 = local_48;
    ::QVariant::QVariant
              ((QVariant *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    (*in_stack_ffffffffffffff48->_vptr_QSystemLocale[2])
              (local_28,in_stack_ffffffffffffff48,0x1f,in_stack_ffffffffffffff50);
    ::QVariant::toString(in_stack_ffffffffffffff38);
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    bVar1 = QString::isEmpty((QString *)0x4d9b22);
    if (!bVar1) goto LAB_004d9c80;
    QString::~QString((QString *)0x4d9b93);
  }
  if (in_EDX == 0) {
    QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d9c36);
    sVar3 = qstrnlen((char *)in_stack_ffffffffffffff48,CONCAT44(in_EDX,in_stack_ffffffffffffff40));
    if (sVar3 != 0) {
      QString::fromLatin1((char *)str,(qsizetype)in_RDI);
      goto LAB_004d9c80;
    }
  }
  else {
    if (in_EDX == 1) {
      pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                         ((QSharedDataPointer<QLocalePrivate> *)0x4d9bd5);
      QLocaleData::currencySymbol(pQVar2->m_data);
      QLocaleData::DataRange::getData(in_RDI,in_stack_ffffffffffffff50);
      goto LAB_004d9c80;
    }
    if (in_EDX == 2) {
      pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                         ((QSharedDataPointer<QLocalePrivate> *)0x4d9c07);
      QLocaleData::currencyDisplayName(pQVar2->m_data);
      QLocaleData::DataRange::getData(in_RDI,in_stack_ffffffffffffff50);
      goto LAB_004d9c80;
    }
  }
  QString::QString((QString *)0x4d9c80);
LAB_004d9c80:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)str;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::currencySymbol(CurrencySymbolFormat format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::CurrencySymbol, format).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    switch (format) {
    case CurrencySymbol:
        return d->m_data->currencySymbol().getData(currency_symbol_data);
    case CurrencyDisplayName:
        return d->m_data->currencyDisplayName().getData(currency_display_name_data);
    case CurrencyIsoCode: {
        const char *code = d->m_data->m_currency_iso_code;
        if (auto len = qstrnlen(code, 3))
            return QString::fromLatin1(code, qsizetype(len));
        break;
    }
    }
    return QString();
}